

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gf.h
# Opt level: O2

uint * gf_matr_mul_vector(uint **a,uint rows,uint cols,uint *v,uint len)

{
  uint uVar1;
  uint *puVar2;
  uint _k;
  ulong uVar3;
  uint uVar4;
  ulong uVar5;
  
  if (rows == len) {
    puVar2 = vector_new(rows);
    for (uVar5 = 0; uVar5 != rows; uVar5 = uVar5 + 1) {
      puVar2[uVar5] = 0;
      uVar4 = 0;
      for (uVar3 = 0; rows != uVar3; uVar3 = uVar3 + 1) {
        uVar1 = gf_mul(a[uVar5][uVar3],v[uVar3]);
        uVar4 = uVar4 ^ uVar1;
        puVar2[uVar5] = uVar4;
      }
    }
    return puVar2;
  }
  fatal((uchar *)"gf_matr_mul_vector",(uchar *)"rows != vector rows\n");
}

Assistant:

uint32_t *gf_matr_mul_vector(uint32_t **a, uint32_t rows, uint32_t cols, uint32_t* v, uint32_t len){
    if(rows != len)
        fatal("gf_matr_mul_vector", "rows != vector rows\n");

    uint32_t *c = vector_new(rows);
    for (uint32_t i = 0; i < rows; i++)
        for (uint32_t j = 0; j < 1; j++)
        {
            c[i] = 0;
            for (uint32_t _k = 0; _k < len; _k++)
                c[i] = gf_sum(c[i], gf_mul(a[i][_k], v[_k]));
        }

    return c;
}